

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbPush.c
# Opt level: O1

void Acb_ObjRemoveConst(Acb_Ntk_t *p,int iObj)

{
  ulong uVar1;
  uint *puVar2;
  ulong uVar3;
  Vec_Int_t *pVVar4;
  int iVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  word *pwVar10;
  char *__assertion;
  uint iObj_00;
  uint uVar11;
  
  if (iObj < 1) {
    __assertion = "i>0";
  }
  else {
    iVar5 = (p->vObjTruth).nSize;
    if (0 < iVar5) {
      if (iVar5 <= iObj) {
LAB_003a74f9:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
      }
      if (iObj < (p->vObjType).nSize) {
        if (0xfd < (byte)((p->vObjType).pArray[(uint)iObj] - 5U)) {
          __assert_fail("!Acb_ObjIsCio(p, iObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbPush.c"
                        ,0xcd,"void Acb_ObjRemoveConst(Acb_Ntk_t *, int)");
        }
        if ((p->vObjFans).nSize <= iObj) {
LAB_003a7518:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar5 = (p->vObjFans).pArray[(uint)iObj];
        if (((long)iVar5 < 0) || ((p->vFanSto).nSize <= iVar5)) {
LAB_003a74bb:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        if ((p->vFanSto).pArray[iVar5] != 0) {
          __assert_fail("Acb_ObjFaninNum(p, iObj) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbPush.c"
                        ,0xce,"void Acb_ObjRemoveConst(Acb_Ntk_t *, int)");
        }
        uVar3 = (p->vObjTruth).pArray[(uint)iObj];
        if (1 < uVar3 + 1) {
          __assert_fail("uTruth == 0 || ~uTruth == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbPush.c"
                        ,0xcf,"void Acb_ObjRemoveConst(Acb_Ntk_t *, int)");
        }
        iVar5 = (p->vFanouts).nSize;
        while( true ) {
          if (iVar5 <= iObj) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                          ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          pVVar4 = (p->vFanouts).pArray;
          if (0 < pVVar4[(uint)iObj].nSize) break;
LAB_003a7267:
          iObj_00 = 0xffffffff;
LAB_003a726d:
          if ((int)iObj_00 < 0) {
            if (pVVar4[(uint)iObj].nSize == 0) {
              if ((p->vObjType).nSize <= iObj) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                              ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
              }
              (p->vObjType).pArray[(uint)iObj] = '\0';
            }
            return;
          }
          if ((p->vObjFans).nSize <= (int)iObj_00) goto LAB_003a7518;
          iVar5 = (p->vObjFans).pArray[iObj_00];
          if (((long)iVar5 < 0) || ((p->vFanSto).nSize <= iVar5)) goto LAB_003a74bb;
          puVar2 = (uint *)((p->vFanSto).pArray + iVar5);
          uVar11 = *puVar2;
          uVar8 = (ulong)uVar11;
          if ((int)uVar11 < 1) {
            uVar8 = 0;
          }
          uVar7 = 0;
          do {
            if (uVar8 == uVar7) {
              uVar11 = 0xffffffff;
              goto LAB_003a72dc;
            }
            uVar1 = uVar7 + 1;
            lVar9 = uVar7 + 1;
            uVar7 = uVar1;
          } while (puVar2[lVar9] != iObj);
          uVar11 = (int)uVar1 - 1;
LAB_003a72dc:
          iVar5 = (p->vObjTruth).nSize;
          if (iVar5 < 1) goto LAB_003a74da;
          if (iVar5 <= (int)iObj_00) goto LAB_003a74f9;
          uVar8 = (p->vObjTruth).pArray[iObj_00];
          Acb_ObjRemoveFaninFanoutOne(p,iObj_00,iObj);
          bVar6 = (byte)uVar11;
          if ((uVar3 & 1) == 0) {
            if (5 < uVar11) {
              __assert_fail("iVar >= 0 && iVar < 6",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                            ,0x337,"word Abc_Tt6Cofactor0(word, int)");
            }
            uVar8 = uVar8 & s_Truths6Neg[uVar11];
            uVar7 = uVar8 << ((byte)(1 << (bVar6 & 0x1f)) & 0x3f);
          }
          else {
            if (5 < uVar11) {
              __assert_fail("iVar >= 0 && iVar < 6",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                            ,0x33c,"word Abc_Tt6Cofactor1(word, int)");
            }
            uVar8 = uVar8 & s_Truths6[uVar11];
            uVar7 = uVar8 >> ((byte)(1 << (bVar6 & 0x1f)) & 0x3f);
          }
          uVar7 = uVar7 | uVar8;
          lVar9 = (long)(int)uVar11;
          if ((s_Truths6Neg[lVar9] & (uVar7 >> ((byte)(1 << (bVar6 & 0x1f)) & 0x3f) ^ uVar7)) != 0)
          {
            __assert_fail("!Abc_Tt6HasVar(t, iVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                          ,0x6cb,"word Abc_Tt6RemoveVar(word, int)");
          }
          if ((int)uVar11 < 5) {
            pwVar10 = s_PMasks[lVar9] + 2;
            do {
              lVar9 = lVar9 + 1;
              bVar6 = (byte)(1 << ((byte)uVar11 & 0x1f));
              uVar7 = (uVar7 & *pwVar10) >> (bVar6 & 0x3f) |
                      (pwVar10[-1] & uVar7) << (bVar6 & 0x3f) |
                      (*(word (*) [3])(pwVar10 + -2))[0] & uVar7;
              uVar11 = uVar11 + 1;
              pwVar10 = pwVar10 + 3;
            } while ((int)lVar9 != 5);
          }
          if ((p->vObjTruth).nSize <= (int)iObj_00) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                          ,0x1cf,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
          }
          (p->vObjTruth).pArray[iObj_00] = uVar7;
          do {
            iVar5 = Acb_ObjSuppMin_int(p,iObj_00);
          } while (iVar5 != 0);
          iVar5 = (p->vFanouts).nSize;
        }
        uVar8 = 0;
        while( true ) {
          iObj_00 = pVVar4[(uint)iObj].pArray[uVar8];
          if ((long)(int)iObj_00 < 1) {
            __assert_fail("i>0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                          ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
          }
          if ((p->vObjType).nSize <= (int)iObj_00) break;
          uVar11 = (uint)(byte)(p->vObjType).pArray[(int)iObj_00];
          if ((4 < uVar11) || ((0x19U >> (uVar11 & 0x1f) & 1) == 0)) goto LAB_003a726d;
          uVar8 = uVar8 + 1;
          if ((uint)pVVar4[(uint)iObj].nSize == uVar8) goto LAB_003a7267;
        }
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                    ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
    }
LAB_003a74da:
    __assertion = "Acb_NtkHasObjTruths(p)";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                ,0x10b,"word Acb_ObjTruth(Acb_Ntk_t *, int)");
}

Assistant:

void Acb_ObjRemoveConst( Acb_Ntk_t * p, int iObj )
{
    int iFanout;
    word uTruth = Acb_ObjTruth( p, iObj );
    assert( !Acb_ObjIsCio(p, iObj) );
    assert( Acb_ObjFaninNum(p, iObj) == 0 );
    assert( uTruth == 0 || ~uTruth == 0 );
    while ( (iFanout = Acb_ObjFindNodeFanout(p, iObj)) >= 0 )
    {
        int iObjIndex = Acb_ObjWhatFanin( p, iFanout, iObj );
        word uTruthF = Acb_ObjTruth( p, iFanout );
        Acb_ObjRemoveFaninFanoutOne( p, iFanout, iObj );
        uTruthF = (uTruth & 1) ? Abc_Tt6Cofactor1(uTruthF, iObjIndex) : Abc_Tt6Cofactor0(uTruthF, iObjIndex);
        Vec_WrdWriteEntry( &p->vObjTruth, iFanout, Abc_Tt6RemoveVar(uTruthF, iObjIndex) );
        Acb_ObjSuppMin( p, iFanout );
    }
    if ( Acb_ObjFanoutNum(p, iObj) == 0 )
        Acb_ObjCleanType( p, iObj );
}